

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

int __thiscall
capnp::compiler::Compiler::CompiledType::clone
          (CompiledType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Mutex *pMVar1;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> *pEVar2;
  BrandScope *pBVar3;
  Locked<kj::Own<capnp::compiler::Compiler::Impl,_std::nullptr_t>_> lock;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> newDecl;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_228;
  ExternalMutexGuarded<capnp::compiler::BrandedDecl> local_178;
  BrandedDecl local_c8;
  
  local_228.mutex = (Mutex *)0x0;
  local_228.value.body.tag = 0;
  local_228.value.brand.disposer = (Disposer *)0x0;
  local_228.value.brand.ptr = (BrandScope *)0x0;
  local_228.value.source._reader.segment = (SegmentReader *)0x0;
  local_228.value.source._reader.capTable = (CapTableReader *)0x0;
  local_228.value.source._reader.data = (void *)0x0;
  local_228.value.source._reader.pointers._0_6_ = 0;
  local_228.value.source._reader.pointers._6_2_ = 0;
  local_228.value.source._reader.dataSize = 0;
  local_228.value.source._reader.pointerCount = 0;
  local_228.value.source._reader.nestingLimit = 0x7fffffff;
  pMVar1 = (Mutex *)(*(long *)__fn + 8);
  local_c8.body.tag = local_c8.body.tag & 0xffffff00;
  kj::_::Mutex::lock(pMVar1,0,&local_c8,___flags);
  BrandedDecl::BrandedDecl(&local_c8,(BrandedDecl *)(__fn + 0x10));
  local_228.mutex = pMVar1;
  BrandedDecl::operator=(&local_228.value,&local_c8);
  if (local_c8.brand.ptr != (BrandScope *)0x0) {
    local_c8.brand.ptr = (BrandScope *)0x0;
    (**(local_c8.brand.disposer)->_vptr_Disposer)();
  }
  if (local_c8.body.tag == 1) {
    local_c8.body.tag = 0;
  }
  if (local_c8.body.tag == 2) {
    local_c8.body.tag = 0;
  }
  if (pMVar1 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(pMVar1,EXCLUSIVE,(Waiter *)0x0);
  }
  pBVar3 = local_228.value.brand.ptr;
  pMVar1 = local_228.mutex;
  local_178.value.body.tag = local_228.value.body.tag;
  if (local_228.value.body.tag == 1) {
    local_178.value.body.field_1._32_8_ = local_228.value.body.field_1._32_8_;
    local_178.value.body.field_1._16_8_ = local_228.value.body.field_1._16_8_;
    local_178.value.body.field_1._24_8_ = local_228.value.body.field_1._24_8_;
    local_178.value.body.field_1._0_8_ = local_228.value.body.field_1._0_8_;
    local_178.value.body.field_1._8_8_ = local_228.value.body.field_1._8_8_;
    local_178.value.body.field_1.space[0x28] = local_228.value.body.field_1.space[0x28];
    if (local_228.value.body.field_1.space[0x28] == '\x01') {
      local_178.value.body.field_1._80_8_ = local_228.value.body.field_1._80_8_;
      local_178.value.body.field_1._88_8_ = local_228.value.body.field_1._88_8_;
      local_178.value.body.field_1._64_8_ = local_228.value.body.field_1._64_8_;
      local_178.value.body.field_1._72_8_ = local_228.value.body.field_1._72_8_;
      local_178.value.body.field_1._48_8_ = local_228.value.body.field_1._48_8_;
      local_178.value.body.field_1._56_8_ = local_228.value.body.field_1._56_8_;
      local_228.value.body.field_1.space[0x28] = '\0';
    }
  }
  if (local_228.value.body.tag == 2) {
    local_178.value.body.field_1._0_8_ = local_228.value.body.field_1._0_8_;
    local_178.value.body.field_1._8_8_ = local_228.value.body.field_1._8_8_;
  }
  local_178.value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_228.value.source._reader.pointers._6_2_,
                local_228.value.source._reader.pointers._0_6_);
  local_178.value.source._reader._38_2_ = local_228.value.source._reader._38_2_;
  local_178.value.source._reader.dataSize = local_228.value.source._reader.dataSize;
  local_178.value.source._reader.pointerCount = local_228.value.source._reader.pointerCount;
  local_178.value.source._reader._44_4_ = local_228.value.source._reader._44_4_;
  local_178.value.source._reader.nestingLimit = local_228.value.source._reader.nestingLimit;
  local_178.value.brand.disposer = local_228.value.brand.disposer;
  local_228.value.brand.ptr = (BrandScope *)0x0;
  local_178.value.source._reader.segment = local_228.value.source._reader.segment;
  local_178.value.source._reader.capTable = local_228.value.source._reader.capTable;
  local_178.value.source._reader.data = local_228.value.source._reader.data;
  local_228.mutex = (Mutex *)0x0;
  this->compiler = *(Compiler **)__fn;
  (this->decl).mutex = pMVar1;
  (this->decl).value.body.tag = local_228.value.body.tag;
  if (local_228.value.body.tag == 1) {
    *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x20) =
         local_178.value.body.field_1._32_8_;
    *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x10) =
         local_178.value.body.field_1._16_8_;
    *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x18) =
         local_178.value.body.field_1._24_8_;
    *(undefined8 *)&(this->decl).value.body.field_1 = local_178.value.body.field_1._0_8_;
    *(undefined8 *)((long)&(this->decl).value.body.field_1 + 8) = local_178.value.body.field_1._8_8_
    ;
    (this->decl).value.body.field_1.space[0x28] = local_178.value.body.field_1.space[0x28];
    if (local_178.value.body.field_1.space[0x28] == '\x01') {
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x50) =
           local_178.value.body.field_1._80_8_;
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x58) =
           local_178.value.body.field_1._88_8_;
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x40) =
           local_178.value.body.field_1._64_8_;
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x48) =
           local_178.value.body.field_1._72_8_;
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x30) =
           local_178.value.body.field_1._48_8_;
      *(undefined8 *)((long)&(this->decl).value.body.field_1 + 0x38) =
           local_178.value.body.field_1._56_8_;
      local_178.value.body.field_1.space[0x28] = '\0';
    }
  }
  if (local_228.value.body.tag == 2) {
    *(undefined8 *)&(this->decl).value.body.field_1 = local_178.value.body.field_1._0_8_;
    *(undefined8 *)((long)&(this->decl).value.body.field_1 + 8) = local_178.value.body.field_1._8_8_
    ;
  }
  (this->decl).value.brand.disposer = local_228.value.brand.disposer;
  (this->decl).value.brand.ptr = pBVar3;
  local_178.value.brand.ptr = (BrandScope *)0x0;
  pEVar2 = &this->decl;
  (pEVar2->value).source._reader.dataSize = local_228.value.source._reader.dataSize;
  (pEVar2->value).source._reader.pointerCount = local_228.value.source._reader.pointerCount;
  *(undefined2 *)&(pEVar2->value).source._reader.field_0x26 = local_228.value.source._reader._38_2_;
  *(ulong *)&(this->decl).value.source._reader.nestingLimit =
       CONCAT44(local_228.value.source._reader._44_4_,local_228.value.source._reader.nestingLimit);
  (this->decl).value.source._reader.data = local_228.value.source._reader.data;
  (this->decl).value.source._reader.pointers =
       (WirePointer *)
       CONCAT26(local_228.value.source._reader.pointers._6_2_,
                local_228.value.source._reader.pointers._0_6_);
  (this->decl).value.source._reader.segment = local_228.value.source._reader.segment;
  (this->decl).value.source._reader.capTable = local_228.value.source._reader.capTable;
  local_178.mutex = (Mutex *)0x0;
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_178);
  kj::ExternalMutexGuarded<capnp::compiler::BrandedDecl>::~ExternalMutexGuarded(&local_228);
  return (int)this;
}

Assistant:

Compiler::CompiledType Compiler::CompiledType::clone() {
  kj::ExternalMutexGuarded<BrandedDecl> newDecl;
  {
    auto lock = compiler.impl.lockExclusive();
    newDecl.set(lock, kj::cp(decl.get(lock)));
  }
  return CompiledType(compiler, kj::mv(newDecl));
}